

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangular.hpp
# Opt level: O0

fvar<double,_2UL> *
ising::free_energy::triangular::
infinite<double,boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>>
          (double Ja,double Jb,double Jc,fvar<double,_2UL> beta)

{
  fvar<double,_2UL> beta_00;
  fvar<double,_2UL> beta_01;
  bool bVar1;
  invalid_argument *piVar2;
  ostream *this;
  void *this_00;
  fvar<double,_2UL> *in_RDI;
  double in_XMM0_Qa;
  double dVar3;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  fvar<double,_2UL> pn;
  double in_stack_000000f0;
  double in_stack_000000f8;
  double in_stack_00000100;
  double in_stack_00000108;
  functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
  *in_stack_00000110;
  double in_stack_00000118;
  functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
  *in_stack_00000120;
  unsigned_long n;
  fvar<double,_2UL> pe;
  fvar<double,_2UL> pz;
  fvar<double,_2UL> logZ;
  real_t pi;
  unsigned_long max_n;
  root_type *in_stack_fffffffffffffcd8;
  fvar<double,_2UL> *pfVar4;
  fvar<double,_2UL> *in_stack_fffffffffffffce0;
  fvar<double,_2UL> *this_01;
  bool local_301;
  fvar<double,_2UL> *cr;
  fvar<double,_2UL> *this_02;
  undefined8 in_stack_fffffffffffffd30;
  fvar<double,_2UL> *in_stack_fffffffffffffd38;
  fvar<double,_2UL> *in_stack_fffffffffffffd40;
  fvar<double,_2UL> *in_stack_fffffffffffffd58;
  fvar<double,_2UL> *in_stack_fffffffffffffd60;
  ulong local_180;
  
  this_02 = (fvar<double,_2UL> *)&stack0x00000008;
  if (in_XMM0_Qa * in_XMM1_Qa * in_XMM2_Qa <= 0.0) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar2,"Ja * Jb * Jc should be positive");
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  cr = in_RDI;
  bVar1 = boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator<=
                    (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  if (bVar1) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar2,"beta should be positive");
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  boost::math::constants::pi<double>();
  log(2.0);
  pfVar4 = (fvar<double,_2UL> *)(this_02->v)._M_elems[0];
  this_01 = (fvar<double,_2UL> *)(this_02->v)._M_elems[1];
  beta_00.v._M_elems[1] = (double)in_stack_fffffffffffffd38;
  beta_00.v._M_elems[0] = (double)in_stack_fffffffffffffd30;
  beta_00.v._M_elems[2] = (double)in_stack_fffffffffffffd40;
  (anonymous_namespace)::
  func<double,boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>>
            ((double)this_02,(double)cr,(double)in_RDI,beta_00);
  standards::
  simpson_2d<ising::free_energy::triangular::(anonymous_namespace)::functor<double,boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>>,double,int>
            (in_stack_00000110,in_stack_00000108,in_stack_00000100,in_stack_000000f8,
             in_stack_000000f0,pn.v._M_elems[2]._4_4_,pn.v._M_elems[2]._0_4_);
  boost::math::differentiation::autodiff_v1::detail::operator+((root_type *)this_01,pfVar4);
  boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator*
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::derivative<int>
            (this_01,(int)((ulong)pfVar4 >> 0x20));
  boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*
            (this_01,(root_type *)pfVar4);
  boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator/
            (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  boost::math::differentiation::autodiff_v1::detail::abs<double,2ul>(this_01);
  for (local_180 = 0x10; local_180 < 0x10001; local_180 = local_180 << 1) {
    log(2.0);
    pfVar4 = (fvar<double,_2UL> *)(this_02->v)._M_elems[0];
    this_01 = (fvar<double,_2UL> *)(this_02->v)._M_elems[1];
    beta_01.v._M_elems[1] = (double)in_stack_fffffffffffffd38;
    beta_01.v._M_elems[0] = (double)in_stack_fffffffffffffd30;
    beta_01.v._M_elems[2] = (double)in_stack_fffffffffffffd40;
    (anonymous_namespace)::
    func<double,boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>>
              ((double)this_02,(double)cr,(double)in_RDI,beta_01);
    standards::
    simpson_2d<ising::free_energy::triangular::(anonymous_namespace)::functor<double,boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>>,double,unsigned_long>
              (in_stack_00000120,in_stack_00000118,(double)in_stack_00000110,in_stack_00000108,
               in_stack_00000100,(unsigned_long)in_stack_000000f8,(unsigned_long)in_stack_000000f0);
    boost::math::differentiation::autodiff_v1::detail::operator+((root_type *)this_01,pfVar4);
    boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator*
              (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator-(this_02,cr);
    in_stack_fffffffffffffd60 =
         (fvar<double,_2UL> *)
         boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::derivative<int>
                   (this_01,(int)((ulong)pfVar4 >> 0x20));
    boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*
              (this_01,(root_type *)pfVar4);
    boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator/
              (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
    boost::math::differentiation::autodiff_v1::detail::abs<double,2ul>(this_01);
    dVar3 = std::numeric_limits<double>::epsilon();
    in_stack_fffffffffffffd40 = (fvar<double,_2UL> *)(dVar3 * 2.0);
    bVar1 = boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator<
                      (this_01,(root_type *)pfVar4);
    local_301 = true;
    if (!bVar1) {
      local_301 = boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator>
                            (this_01,pfVar4);
    }
    if (local_301 != false) break;
    if (local_180 == 0x10000) {
      this = std::operator<<((ostream *)&std::cerr,"Warning: integration not converge with n = ");
      this_00 = (void *)std::ostream::operator<<(this,0x10000);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    }
  }
  boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator-(this_01);
  boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator/
            (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  return cr;
}

Assistant:

inline U infinite(T Ja, T Jb, T Jc, U beta) {
  const unsigned long max_n = 1 << 16;
  typedef T real_t;
  if (Ja * Jb * Jc <= 0)
    throw(std::invalid_argument("Ja * Jb * Jc should be positive"));
  if (beta <= 0)
    throw(std::invalid_argument("beta should be positive"));
  real_t pi = boost::math::constants::pi<real_t>();
  auto logZ =
      log(real_t(2)) + standards::simpson_2d(func(Ja, Jb, Jc, beta), real_t(0),
                                             real_t(0), 2 * pi, 2 * pi, 8, 8);
  auto pz = logZ;
  auto pe = abs(beta * beta * logZ.derivative(2) / logZ);
  for (unsigned long n = 16; n <= max_n; n *= 2) {
    logZ = log(real_t(2)) + standards::simpson_2d(func(Ja, Jb, Jc, beta),
                                                  real_t(0), real_t(0), 2 * pi,
                                                  2 * pi, n, n);
    auto pn = abs(beta * beta * (logZ - pz).derivative(2) / logZ);
    if (pn < 2 * std::numeric_limits<real_t>::epsilon() || pn > pe)
      break;
    if (n == max_n)
      std::cerr << "Warning: integration not converge with n = " << max_n
                << std::endl;
    pz = logZ;
    pe = pn;
  }
  return -logZ / beta;
}